

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  long lVar1;
  uint *puVar2;
  void *alloc_2;
  uint uVar3;
  void *alloc;
  void *alloc_1;
  long lVar4;
  
  if ((((ulong)workspace & 7) == 0 && 0xdf8 < workspaceSize) &&
     (workspace != (void *)0x0 && 0xdf7 < (long)workspaceSize)) {
    lVar4 = (long)workspace + 0xdf8;
    memset(workspace,0,0xdf8);
    *(void **)((long)workspace + 0x230) = workspace;
    *(size_t *)((long)workspace + 0x238) = (long)workspace + workspaceSize;
    *(long *)((long)workspace + 0x240) = lVar4;
    *(long *)((long)workspace + 0x248) = lVar4;
    *(long *)((long)workspace + 0x250) = lVar4;
    *(size_t *)((long)workspace + 600) = (long)workspace + workspaceSize;
    *(undefined4 *)((long)workspace + 0x264) = 0;
    *(undefined4 *)((long)workspace + 0x26c) = 1;
    *(size_t *)((long)workspace + 0x308) = workspaceSize;
    if (0x3db7 < workspaceSize - 0xdf8) {
      *(long *)((long)workspace + 0xc00) = lVar4;
      lVar4 = (long)workspace + 0x31d8;
      *(long *)((long)workspace + 0x240) = lVar4;
      *(long *)((long)workspace + 0x248) = lVar4;
      *(long *)((long)workspace + 0x250) = lVar4;
      *(long *)((long)workspace + 0xc08) = (long)workspace + 0x1fe8;
      if ((long)workspaceSize < 0x4bb0) {
        *(undefined1 *)((long)workspace + 0x260) = 1;
        lVar4 = 0;
      }
      else {
        lVar1 = (long)workspace + 0x4bb0;
        *(long *)((long)workspace + 0x240) = lVar1;
        *(long *)((long)workspace + 0x248) = lVar1;
        *(long *)((long)workspace + 0x250) = lVar1;
      }
      *(long *)((long)workspace + 0xd28) = lVar4;
      puVar2 = (uint *)cpuid_basic_info(0);
      uVar3 = 0;
      if ((*puVar2 != 0) && (uVar3 = 0, 6 < *puVar2)) {
        lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar3 = *(uint *)(lVar4 + 4) >> 8 & 1;
      }
      *(uint *)((long)workspace + 8) = uVar3;
      return (ZSTD_CCtx *)workspace;
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}